

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void last_wal_flush_header_test(void)

{
  fdb_status fVar1;
  size_t metalen;
  void *pvVar2;
  fdb_file_handle *in_stack_fffffffffffffa18;
  undefined7 in_stack_fffffffffffffa20;
  fdb_isolation_level_t in_stack_fffffffffffffa27;
  fdb_file_handle *in_stack_fffffffffffffa28;
  fdb_commit_opt_t in_stack_fffffffffffffa37;
  fdb_file_handle *in_stack_fffffffffffffa38;
  size_t in_stack_fffffffffffffa40;
  fdb_doc *local_598;
  fdb_doc *local_590;
  fdb_doc *local_588;
  fdb_doc *local_580;
  fdb_doc *local_578;
  fdb_doc *local_570;
  fdb_doc *local_568;
  fdb_doc *local_560;
  fdb_doc *local_548;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_status status;
  fdb_doc *rdoc;
  fdb_doc **doc;
  fdb_kvs_handle *db_txn2;
  fdb_kvs_handle *db_txn1;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile_txn2;
  fdb_file_handle *dbfile_txn1;
  fdb_file_handle *dbfile;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.purging_interval = 1;
  fconfig.wal_threshold._4_4_ = 0;
  fconfig.flags._3_1_ = 0;
  fdb_open((fdb_file_handle **)fconfig._240_8_,(char *)fconfig._232_8_,
           (fdb_config *)fconfig.log_msg_level);
  fdb_open((fdb_file_handle **)fconfig._240_8_,(char *)fconfig._232_8_,
           (fdb_config *)fconfig.log_msg_level);
  fdb_kvs_open_default
            ((fdb_file_handle *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
             &in_stack_fffffffffffffa18->root,(fdb_kvs_config *)0x11a1c6);
  fdb_kvs_open_default
            ((fdb_file_handle *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
             &in_stack_fffffffffffffa18->root,(fdb_kvs_config *)0x11a1dd);
  for (n = 0; n < 0x1e; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf((char *)&fconfig.num_blocks_readahead,"body%d",(ulong)(uint)n);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    pvVar2 = (void *)0x11a2ad;
    metalen = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffffa28,
                   (void *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
                   (size_t)in_stack_fffffffffffffa18,pvVar2,metalen,(void *)0x11a2e4,
                   in_stack_fffffffffffffa40);
  }
  for (n = 0; n < 2; n = n + 1) {
    fdb_set(db_txn1,*(fdb_doc **)(&stack0xfffffffffffffa18 + (long)n * 8));
  }
  fdb_begin_transaction(in_stack_fffffffffffffa28,in_stack_fffffffffffffa27);
  for (n = 2; n < 4; n = n + 1) {
    fdb_set(db_txn2,*(fdb_doc **)(&stack0xfffffffffffffa18 + (long)n * 8));
  }
  fdb_commit(in_stack_fffffffffffffa18,'\0');
  fdb_close(in_stack_fffffffffffffa18);
  fdb_close(in_stack_fffffffffffffa18);
  fdb_open((fdb_file_handle **)fconfig._240_8_,(char *)fconfig._232_8_,
           (fdb_config *)fconfig.log_msg_level);
  fdb_open((fdb_file_handle **)fconfig._240_8_,(char *)fconfig._232_8_,
           (fdb_config *)fconfig.log_msg_level);
  fdb_kvs_open_default
            ((fdb_file_handle *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
             &in_stack_fffffffffffffa18->root,(fdb_kvs_config *)0x11a3c9);
  pvVar2 = (void *)0x11a3e0;
  fdb_kvs_open_default
            ((fdb_file_handle *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
             &in_stack_fffffffffffffa18->root,(fdb_kvs_config *)0x11a3e0);
  n = 0;
  do {
    if (3 < n) {
      fdb_begin_transaction(in_stack_fffffffffffffa28,in_stack_fffffffffffffa27);
      for (n = 2; n < 4; n = n + 1) {
        fdb_set(db_txn2,*(fdb_doc **)(&stack0xfffffffffffffa18 + (long)n * 8));
      }
      for (n = 4; n < 6; n = n + 1) {
        fdb_set(db_txn1,*(fdb_doc **)(&stack0xfffffffffffffa18 + (long)n * 8));
      }
      fdb_end_transaction(in_stack_fffffffffffffa38,in_stack_fffffffffffffa37);
      fdb_close(in_stack_fffffffffffffa18);
      fdb_close(in_stack_fffffffffffffa18);
      fdb_open((fdb_file_handle **)fconfig._240_8_,(char *)fconfig._232_8_,
               (fdb_config *)fconfig.log_msg_level);
      fdb_open((fdb_file_handle **)fconfig._240_8_,(char *)fconfig._232_8_,
               (fdb_config *)fconfig.log_msg_level);
      fdb_kvs_open_default
                ((fdb_file_handle *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
                 &in_stack_fffffffffffffa18->root,(fdb_kvs_config *)0x11a61b);
      pvVar2 = (void *)0x11a632;
      fdb_kvs_open_default
                ((fdb_file_handle *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
                 &in_stack_fffffffffffffa18->root,(fdb_kvs_config *)0x11a632);
      n = 0;
      do {
        if (5 < n) {
          for (n = 4; n < 6; n = n + 1) {
            fdb_set(db_txn1,*(fdb_doc **)(&stack0xfffffffffffffa18 + (long)n * 8));
          }
          fdb_begin_transaction(in_stack_fffffffffffffa28,in_stack_fffffffffffffa27);
          for (n = 6; n < 8; n = n + 1) {
            fdb_set(db_txn2,*(fdb_doc **)(&stack0xfffffffffffffa18 + (long)n * 8));
          }
          fdb_commit(in_stack_fffffffffffffa18,'\0');
          fdb_open((fdb_file_handle **)fconfig._240_8_,(char *)fconfig._232_8_,
                   (fdb_config *)fconfig.log_msg_level);
          fdb_kvs_open_default
                    ((fdb_file_handle *)
                     CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
                     &in_stack_fffffffffffffa18->root,(fdb_kvs_config *)0x11a7e4);
          fdb_begin_transaction(in_stack_fffffffffffffa28,in_stack_fffffffffffffa27);
          for (n = 8; n < 10; n = n + 1) {
            fdb_set((fdb_kvs_handle *)doc,*(fdb_doc **)(&stack0xfffffffffffffa18 + (long)n * 8));
          }
          fdb_end_transaction(in_stack_fffffffffffffa38,in_stack_fffffffffffffa37);
          fdb_close(in_stack_fffffffffffffa18);
          fdb_close(in_stack_fffffffffffffa18);
          fdb_close(in_stack_fffffffffffffa18);
          fdb_open((fdb_file_handle **)fconfig._240_8_,(char *)fconfig._232_8_,
                   (fdb_config *)fconfig.log_msg_level);
          pvVar2 = (void *)0x11a879;
          fdb_kvs_open_default
                    ((fdb_file_handle *)
                     CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
                     &in_stack_fffffffffffffa18->root,(fdb_kvs_config *)0x11a879);
          n = 0;
          do {
            if (9 < n) {
              fdb_open((fdb_file_handle **)fconfig._240_8_,(char *)fconfig._232_8_,
                       (fdb_config *)fconfig.log_msg_level);
              fdb_open((fdb_file_handle **)fconfig._240_8_,(char *)fconfig._232_8_,
                       (fdb_config *)fconfig.log_msg_level);
              fdb_kvs_open_default
                        ((fdb_file_handle *)
                         CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
                         &in_stack_fffffffffffffa18->root,(fdb_kvs_config *)0x11aa2c);
              fdb_kvs_open_default
                        ((fdb_file_handle *)
                         CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
                         &in_stack_fffffffffffffa18->root,(fdb_kvs_config *)0x11aa43);
              fdb_begin_transaction(in_stack_fffffffffffffa28,in_stack_fffffffffffffa27);
              fdb_set(db_txn1,local_598);
              fdb_commit(in_stack_fffffffffffffa18,'\0');
              fdb_set(db_txn1,local_590);
              fdb_set(db_txn2,local_588);
              fdb_commit(in_stack_fffffffffffffa18,'\0');
              fdb_set(db_txn2,local_580);
              fdb_begin_transaction(in_stack_fffffffffffffa28,in_stack_fffffffffffffa27);
              fdb_set((fdb_kvs_handle *)doc,local_578);
              fdb_end_transaction(in_stack_fffffffffffffa38,in_stack_fffffffffffffa37);
              fdb_set((fdb_kvs_handle *)doc,local_570);
              fdb_set(db_txn1,local_568);
              fdb_end_transaction(in_stack_fffffffffffffa38,in_stack_fffffffffffffa37);
              fdb_set(db_txn1,local_560);
              fdb_commit(in_stack_fffffffffffffa18,'\0');
              fdb_close(in_stack_fffffffffffffa18);
              fdb_close(in_stack_fffffffffffffa18);
              fdb_close(in_stack_fffffffffffffa18);
              fdb_open((fdb_file_handle **)fconfig._240_8_,(char *)fconfig._232_8_,
                       (fdb_config *)fconfig.log_msg_level);
              pvVar2 = (void *)0x11ab9a;
              fdb_kvs_open_default
                        ((fdb_file_handle *)
                         CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
                         &in_stack_fffffffffffffa18->root,(fdb_kvs_config *)0x11ab9a);
              n = 10;
              do {
                if (0x11 < n) {
                  fdb_open((fdb_file_handle **)fconfig._240_8_,(char *)fconfig._232_8_,
                           (fdb_config *)fconfig.log_msg_level);
                  fdb_kvs_open_default
                            ((fdb_file_handle *)
                             CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
                             &in_stack_fffffffffffffa18->root,(fdb_kvs_config *)0x11acc3);
                  fdb_begin_transaction(in_stack_fffffffffffffa28,in_stack_fffffffffffffa27);
                  fdb_set(db_txn2,local_548);
                  fdb_compact((fdb_file_handle *)
                              CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
                              (char *)in_stack_fffffffffffffa18);
                  fdb_end_transaction(in_stack_fffffffffffffa38,in_stack_fffffffffffffa37);
                  fdb_close(in_stack_fffffffffffffa18);
                  fdb_close(in_stack_fffffffffffffa18);
                  for (n = 0; n < 0x1e; n = n + 1) {
                    fdb_doc_free((fdb_doc *)0x11ad3e);
                  }
                  fdb_shutdown();
                  memleak_end();
                  if (last_wal_flush_header_test::__test_pass == 0) {
                    fprintf(_stderr,"%s FAILED\n","last wal flush header test");
                  }
                  else {
                    fprintf(_stderr,"%s PASSED\n","last wal flush header test");
                  }
                  return;
                }
                fdb_doc_create((fdb_doc **)in_stack_fffffffffffffa28,
                               (void *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20)
                               ,(size_t)in_stack_fffffffffffffa18,pvVar2,0,(void *)0x11abf3,
                               in_stack_fffffffffffffa40);
                fVar1 = fdb_get(db_txn1,(fdb_doc *)0x0);
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xfee);
                  last_wal_flush_header_test::__test_pass = 0;
                  if (fVar1 != FDB_RESULT_SUCCESS) {
                    __assert_fail("status == FDB_RESULT_SUCCESS",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                  ,0xfee,"void last_wal_flush_header_test()");
                  }
                }
                pvVar2 = (void *)0x11ac7c;
                fdb_doc_free((fdb_doc *)0x11ac7c);
                n = n + 1;
              } while( true );
            }
            fdb_doc_create((fdb_doc **)in_stack_fffffffffffffa28,
                           (void *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
                           (size_t)in_stack_fffffffffffffa18,pvVar2,0,(void *)0x11a8d2,
                           in_stack_fffffffffffffa40);
            fVar1 = fdb_get(db_txn1,(fdb_doc *)0x0);
            if ((n < 6) || (7 < n)) {
              if (fVar1 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xfc3);
                last_wal_flush_header_test::__test_pass = 0;
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                ,0xfc3,"void last_wal_flush_header_test()");
                }
              }
            }
            else if (fVar1 == FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xfc5);
              last_wal_flush_header_test::__test_pass = 0;
              __assert_fail("status != FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0xfc5,"void last_wal_flush_header_test()");
            }
            pvVar2 = (void *)0x11a9ce;
            fdb_doc_free((fdb_doc *)0x11a9ce);
            n = n + 1;
          } while( true );
        }
        fdb_doc_create((fdb_doc **)in_stack_fffffffffffffa28,
                       (void *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
                       (size_t)in_stack_fffffffffffffa18,pvVar2,0,(void *)0x11a68b,
                       in_stack_fffffffffffffa40);
        fVar1 = fdb_get(db_txn1,(fdb_doc *)0x0);
        if ((n < 4) && (fVar1 != FDB_RESULT_SUCCESS)) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xf9c);
          last_wal_flush_header_test::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xf9c,"void last_wal_flush_header_test()");
          }
        }
        pvVar2 = (void *)0x11a71e;
        fdb_doc_free((fdb_doc *)0x11a71e);
        n = n + 1;
      } while( true );
    }
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffffa28,
                   (void *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
                   (size_t)in_stack_fffffffffffffa18,pvVar2,0,(void *)0x11a439,
                   in_stack_fffffffffffffa40);
    fVar1 = fdb_get(db_txn1,(fdb_doc *)0x0);
    if (n < 2) {
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xf7c);
        last_wal_flush_header_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xf7c,"void last_wal_flush_header_test()");
        }
      }
    }
    else if (fVar1 == FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xf7e);
      last_wal_flush_header_test::__test_pass = 0;
      __assert_fail("status != FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xf7e,"void last_wal_flush_header_test()");
    }
    pvVar2 = (void *)0x11a52f;
    fdb_doc_free((fdb_doc *)0x11a52f);
    n = n + 1;
  } while( true );
}

Assistant:

void last_wal_flush_header_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 30;
    fdb_file_handle *dbfile, *dbfile_txn1, *dbfile_txn2;
    fdb_kvs_handle *db, *db_txn1, *db_txn2;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "dummy1", &fconfig);
    fdb_open(&dbfile_txn1, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    fdb_kvs_open_default(dbfile_txn1, &db_txn1, &kvs_config);

    // create docs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                                (void*)metabuf, strlen(metabuf),
                                (void*)bodybuf, strlen(bodybuf));
    }

    // insert docs without transaction
    for (i=0;i<2;++i) {
        fdb_set(db, doc[i]);
    }
    // insert docs using transaction
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);
    for (i=2;i<4;++i){
        fdb_set(db_txn1, doc[i]);
    }
    // commit without transaction
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // close & reopen db
    fdb_close(dbfile);
    fdb_close(dbfile_txn1);
    fdb_open(&dbfile, "dummy1", &fconfig);
    fdb_open(&dbfile_txn1, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    fdb_kvs_open_default(dbfile_txn1, &db_txn1, &kvs_config);

    // retrieve check
    for (i=0;i<4;++i){
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        if (i<2) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            TEST_CHK(status != FDB_RESULT_SUCCESS);
        }
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // insert docs using transaction
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);
    for (i=2;i<4;++i){
        fdb_set(db_txn1, doc[i]);
    }
    // insert docs without transaction
    for (i=4;i<6;++i){
        fdb_set(db, doc[i]);
    }
    fdb_end_transaction(dbfile_txn1, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // close & reopen db
    fdb_close(dbfile);
    fdb_close(dbfile_txn1);
    fdb_open(&dbfile, "dummy1", &fconfig);
    fdb_open(&dbfile_txn1, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    fdb_kvs_open_default(dbfile_txn1, &db_txn1, &kvs_config);

    // retrieve check
    for (i=0;i<6;++i){
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        if (i<4) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            // doesn't matter
        }
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // insert docs without transaction
    for (i=4;i<6;++i) {
        fdb_set(db, doc[i]);
    }
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);
    for (i=6;i<8;++i) {
        fdb_set(db_txn1, doc[i]);
    }
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // begin another transaction
    fdb_open(&dbfile_txn2, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile_txn2, &db_txn2, &kvs_config);
    fdb_begin_transaction(dbfile_txn2, FDB_ISOLATION_READ_COMMITTED);
    for (i=8;i<10;++i){
        fdb_set(db_txn2, doc[i]);
    }
    fdb_end_transaction(dbfile_txn2, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // close & reopen db
    fdb_close(dbfile);
    fdb_close(dbfile_txn1);
    fdb_close(dbfile_txn2);
    fdb_open(&dbfile, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);

    // retrieve check
    for (i=0;i<10;++i){
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        if (i<6 || i>=8) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            TEST_CHK(status != FDB_RESULT_SUCCESS);
        }
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    fdb_open(&dbfile_txn1, "dummy1", &fconfig);
    fdb_open(&dbfile_txn2, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile_txn1, &db_txn1, &kvs_config);
    fdb_kvs_open_default(dbfile_txn2, &db_txn2, &kvs_config);
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);

    fdb_set(db, doc[10]);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    fdb_set(db, doc[11]);
    fdb_set(db_txn1, doc[12]);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    fdb_set(db_txn1, doc[13]);
    fdb_begin_transaction(dbfile_txn2, FDB_ISOLATION_READ_COMMITTED);
    fdb_set(db_txn2, doc[14]);
    fdb_end_transaction(dbfile_txn1, FDB_COMMIT_MANUAL_WAL_FLUSH);

    fdb_set(db_txn2, doc[15]);
    fdb_set(db, doc[16]);
    fdb_end_transaction(dbfile_txn2, FDB_COMMIT_MANUAL_WAL_FLUSH);

    fdb_set(db, doc[17]);
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    fdb_close(dbfile);
    fdb_close(dbfile_txn1);
    fdb_close(dbfile_txn2);
    fdb_open(&dbfile, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);

    // retrieve check
    for (i=10;i<18;++i){
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    fdb_open(&dbfile_txn1, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile_txn1, &db_txn1, &kvs_config);
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);
    fdb_set(db_txn1, doc[20]);

    fdb_compact(dbfile, "dummy2");

    fdb_end_transaction(dbfile_txn1, FDB_COMMIT_MANUAL_WAL_FLUSH);
    fdb_close(dbfile);
    fdb_close(dbfile_txn1);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("last wal flush header test");
}